

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::CZ<std::complex<double>_>::equals
          (CZ<std::complex<double>_> *this,QObject<std::complex<double>_> *other)

{
  int iVar1;
  int iVar2;
  bool local_51;
  QControlledGate2<std::complex<double>_> *local_40;
  CG *p;
  QObject<std::complex<double>_> *other_local;
  CZ<std::complex<double>_> *this_local;
  
  if (other == (QObject<std::complex<double>_> *)0x0) {
    local_40 = (QControlledGate2<std::complex<double>_> *)0x0;
  }
  else {
    local_40 = (QControlledGate2<std::complex<double>_> *)
               __dynamic_cast(other,&QObject<std::complex<double>>::typeinfo,
                              &CZ<std::complex<double>>::typeinfo,0);
  }
  if (local_40 != (QControlledGate2<std::complex<double>_> *)0x0) {
    iVar1 = QControlledGate2<std::complex<double>_>::controlState(local_40);
    iVar2 = QControlledGate2<std::complex<double>_>::controlState
                      (&this->super_QControlledGate2<std::complex<double>_>);
    if (iVar1 != iVar2) {
      return false;
    }
    iVar1 = QControlledGate2<std::complex<double>_>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      iVar1 = QControlledGate2<std::complex<double>_>::control
                        (&this->super_QControlledGate2<std::complex<double>_>);
      iVar2 = (*(this->super_QControlledGate2<std::complex<double>_>).
                super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                _vptr_QObject[0xf])();
      if (iVar1 < iVar2) {
        return true;
      }
    }
    iVar1 = QControlledGate2<std::complex<double>_>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    local_51 = false;
    if (iVar2 < iVar1) {
      iVar1 = QControlledGate2<std::complex<double>_>::control
                        (&this->super_QControlledGate2<std::complex<double>_>);
      iVar2 = (*(this->super_QControlledGate2<std::complex<double>_>).
                super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                _vptr_QObject[0xf])();
      local_51 = iVar2 < iVar1;
    }
    return local_51;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CZ< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }